

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::_Test_TruncatedTrailingRecordIsIgnored::~_Test_TruncatedTrailingRecordIsIgnored
          (_Test_TruncatedTrailingRecordIsIgnored *this)

{
  _Test_TruncatedTrailingRecordIsIgnored *this_local;
  
  LogTest::~LogTest(&this->super_LogTest);
  return;
}

Assistant:

TEST(LogTest, TruncatedTrailingRecordIsIgnored) {
  Write("foo");
  ShrinkSize(4);  // Drop all payload as well as a header byte
  ASSERT_EQ("EOF", Read());
  // Truncated last record is ignored, not treated as an error.
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}